

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pseudotopoorder.cpp
# Opt level: O2

void __thiscall PseudoTopoOrder::RecalcTopoInverse(PseudoTopoOrder *this)

{
  pointer piVar1;
  pointer piVar2;
  pointer piVar3;
  int i;
  ulong uVar4;
  
  piVar1 = (this->pto).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
           ._M_start;
  piVar2 = (this->pto).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
           ._M_finish;
  piVar3 = (this->pto_inverse).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (uVar4 = 0; uVar4 < (ulong)((long)piVar2 - (long)piVar1 >> 2); uVar4 = uVar4 + 1) {
    piVar3[piVar1[uVar4]] = (int)uVar4;
  }
  if (0 < this->first_unknown) {
    this->first_unknown = 0;
  }
  this->path_filled = false;
  return;
}

Assistant:

void PseudoTopoOrder::RecalcTopoInverse()
{
	for (int i = 0; i < pto.size(); ++i)
	{
		pto_inverse[pto[i]] = i;
	}

	AnnounceModification(0);
}